

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O0

FixedArgSig * __thiscall
winmd::reader::NamedArgSig::parse_value
          (FixedArgSig *__return_storage_ptr__,NamedArgSig *this,database *db,byte_view *data)

{
  bool bVar1;
  cache *this_00;
  TypeDef TVar2;
  string_view sVar3;
  size_t local_170;
  char *local_168;
  allocator<char> local_159;
  string local_158;
  byte local_131;
  undefined1 local_130 [7];
  bool is_array;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  table_base *local_c8;
  uint32_t local_c0;
  undefined1 local_b8 [8];
  TypeDef type_def;
  char *pcStack_a0;
  undefined1 local_98 [8];
  string_view type_string;
  size_t local_78;
  char *local_70;
  ElementType local_65;
  ElementType type;
  allocator<char> local_51;
  string local_50;
  ElementType local_29;
  byte_view *pbStack_28;
  ElementType field_or_prop;
  byte_view *data_local;
  database *db_local;
  NamedArgSig *this_local;
  
  pbStack_28 = data;
  data_local = (byte_view *)db;
  db_local = (database *)this;
  this_local = (NamedArgSig *)__return_storage_ptr__;
  local_29 = read<winmd::reader::ElementType>(data);
  if ((local_29 != Field) && (local_29 != Property)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"NamedArg must be either FIELD or PROPERTY",&local_51);
    impl::throw_invalid(&local_50);
  }
  local_65 = read<winmd::reader::ElementType>(pbStack_28);
  if (local_65 == Type) {
    sVar3 = read<std::basic_string_view<char,std::char_traits<char>>>(pbStack_28);
    local_78 = sVar3._M_len;
    (this->name)._M_len = local_78;
    local_70 = sVar3._M_str;
    (this->name)._M_str = local_70;
    join_0x00000010_0x00000000_ =
         read<std::basic_string_view<char,std::char_traits<char>>>(pbStack_28);
    FixedArgSig::FixedArgSig(__return_storage_ptr__,(SystemType)join_0x00000010_0x00000000_);
  }
  else if (local_65 == Enum) {
    _local_98 = read<std::basic_string_view<char,std::char_traits<char>>>(pbStack_28);
    join_0x00000010_0x00000000_ =
         read<std::basic_string_view<char,std::char_traits<char>>>(pbStack_28);
    (this->name)._M_len = type_def.super_row_base<winmd::reader::TypeDef>._8_8_;
    (this->name)._M_str = pcStack_a0;
    this_00 = reader::database::get_cache((database *)data_local);
    TVar2 = cache::find(this_00,(string_view *)local_98);
    local_c8 = TVar2.super_row_base<winmd::reader::TypeDef>.m_table;
    local_c0 = TVar2.super_row_base<winmd::reader::TypeDef>.m_index;
    local_b8 = (undefined1  [8])local_c8;
    type_def.super_row_base<winmd::reader::TypeDef>.m_table._0_4_ = local_c0;
    bVar1 = reader::row_base::operator_cast_to_bool((row_base *)local_b8);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"CustomAttribute named param referenced unresolved enum type",
                 &local_e9);
      impl::throw_invalid(&local_e8);
    }
    bVar1 = TypeDef::is_enum((TypeDef *)local_b8);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"CustomAttribute named param referenced non-enum type",
                 &local_111);
      impl::throw_invalid(&local_110);
    }
    TypeDef::get_enum_definition((EnumDefinition *)local_130,(TypeDef *)local_b8);
    FixedArgSig::FixedArgSig(__return_storage_ptr__,(EnumDefinition *)local_130,pbStack_28);
  }
  else {
    local_131 = local_65 == SZArray;
    if ((bool)local_131) {
      local_65 = read<winmd::reader::ElementType>(pbStack_28);
    }
    if ((local_65 < Boolean) || (String < local_65)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,
                 "CustomAttribute named param must be a primitive, System.Type, or an Enum",
                 &local_159);
      impl::throw_invalid(&local_158);
    }
    sVar3 = read<std::basic_string_view<char,std::char_traits<char>>>(pbStack_28);
    local_170 = sVar3._M_len;
    (this->name)._M_len = local_170;
    local_168 = sVar3._M_str;
    (this->name)._M_str = local_168;
    FixedArgSig::FixedArgSig(__return_storage_ptr__,local_65,(bool)(local_131 & 1),pbStack_28);
  }
  return __return_storage_ptr__;
}

Assistant:

FixedArgSig parse_value(database const& db, byte_view& data)
        {
            auto const field_or_prop = read<ElementType>(data);
            if (field_or_prop != ElementType::Field && field_or_prop != ElementType::Property)
            {
                impl::throw_invalid("NamedArg must be either FIELD or PROPERTY");
            }

            auto type = read<ElementType>(data);
            switch (type)
            {
            case ElementType::Type:
                name = read<std::string_view>(data);
                return FixedArgSig{ ElemSig::SystemType{read<std::string_view>(data)} };

            case ElementType::Enum:
            {
                auto type_string = read<std::string_view>(data);
                name = read<std::string_view>(data);
                auto type_def = db.get_cache().find(type_string);
                if (!type_def)
                {
                    impl::throw_invalid("CustomAttribute named param referenced unresolved enum type");
                }
                if (!type_def.is_enum())
                {
                    impl::throw_invalid("CustomAttribute named param referenced non-enum type");
                }

                return FixedArgSig{ type_def.get_enum_definition(), data };
            }

            default:
            {
                bool const is_array = (type == ElementType::SZArray);
                if (is_array)
                {
                    type = read<ElementType>(data);
                }
                if (type < ElementType::Boolean || ElementType::String < type)
                {
                    impl::throw_invalid("CustomAttribute named param must be a primitive, System.Type, or an Enum");
                }
                name = read<std::string_view>(data);
                return FixedArgSig{ type, is_array, data };
            }
            }
        }